

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManagedStatic.h
# Opt level: O2

void * llvm::object_creator<(anonymous_namespace)::CommandLineParser>::call(void)

{
  void **ppvVar1;
  CommandLineParser *this;
  SubCommand *pSVar2;
  
  this = (CommandLineParser *)operator_new(0x130);
  (this->ProgramName)._M_dataplus._M_p = (pointer)&(this->ProgramName).field_2;
  (this->ProgramName)._M_string_length = 0;
  (this->ProgramName).field_2._M_local_buf[0] = '\0';
  ppvVar1 = (this->RegisteredOptionCategories).SmallStorage;
  (this->MoreHelp).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ProgramOverview).Data = (char *)0x0;
  (this->ProgramOverview).Length = 0;
  (this->MoreHelp).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MoreHelp).super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RegisteredOptionCategories).super_SmallPtrSetImpl<llvm::cl::OptionCategory_*>.
  super_SmallPtrSetImplBase.SmallArray = ppvVar1;
  (this->RegisteredOptionCategories).super_SmallPtrSetImpl<llvm::cl::OptionCategory_*>.
  super_SmallPtrSetImplBase.CurArray = ppvVar1;
  (this->RegisteredOptionCategories).super_SmallPtrSetImpl<llvm::cl::OptionCategory_*>.
  super_SmallPtrSetImplBase.CurArraySize = 0x10;
  (this->RegisteredOptionCategories).super_SmallPtrSetImpl<llvm::cl::OptionCategory_*>.
  super_SmallPtrSetImplBase.NumNonEmpty = 0;
  (this->RegisteredOptionCategories).super_SmallPtrSetImpl<llvm::cl::OptionCategory_*>.
  super_SmallPtrSetImplBase.NumTombstones = 0;
  ppvVar1 = (this->RegisteredSubCommands).SmallStorage;
  (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
  super_SmallPtrSetImplBase.SmallArray = ppvVar1;
  (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
  super_SmallPtrSetImplBase.CurArray = ppvVar1;
  (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
  super_SmallPtrSetImplBase.CurArraySize = 4;
  (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
  super_SmallPtrSetImplBase.NumNonEmpty = 0;
  (this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>.
  super_SmallPtrSetImplBase.NumTombstones = 0;
  this->ActiveSubCommand = (SubCommand *)0x0;
  pSVar2 = ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
           ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                        *)cl::TopLevelSubCommand);
  anon_unknown.dwarf_20661e::CommandLineParser::registerSubCommand(this,pSVar2);
  pSVar2 = ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
           ::operator*((ManagedStatic<llvm::cl::SubCommand,_llvm::object_creator<llvm::cl::SubCommand>,_llvm::object_deleter<llvm::cl::SubCommand>_>
                        *)cl::AllSubCommands);
  anon_unknown.dwarf_20661e::CommandLineParser::registerSubCommand(this,pSVar2);
  return this;
}

Assistant:

static void *call() { return new C(); }